

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_msg_buffer-inl.h
# Opt level: O2

log_msg_buffer * __thiscall
spdlog::details::log_msg_buffer::operator=(log_msg_buffer *this,log_msg_buffer *other)

{
  char *pcVar1;
  long lVar2;
  log_msg_buffer *plVar3;
  log_msg_buffer *plVar4;
  
  plVar3 = other;
  plVar4 = this;
  for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
    (plVar4->super_log_msg).logger_name.data_ = (plVar3->super_log_msg).logger_name.data_;
    plVar3 = (log_msg_buffer *)&(plVar3->super_log_msg).logger_name.size_;
    plVar4 = (log_msg_buffer *)&(plVar4->super_log_msg).logger_name.size_;
  }
  (this->buffer).super_buffer<char>.size_ = 0;
  pcVar1 = (other->buffer).super_buffer<char>.ptr_;
  ::fmt::v7::detail::buffer<char>::append<char>
            (&(this->buffer).super_buffer<char>,pcVar1,
             pcVar1 + (other->buffer).super_buffer<char>.size_);
  pcVar1 = (this->buffer).super_buffer<char>.ptr_;
  (this->super_log_msg).logger_name.data_ = pcVar1;
  (this->super_log_msg).payload.data_ = pcVar1 + (this->super_log_msg).logger_name.size_;
  return this;
}

Assistant:

SPDLOG_INLINE log_msg_buffer &log_msg_buffer::operator=(const log_msg_buffer &other)
{
    log_msg::operator=(other);
    buffer.clear();
    buffer.append(other.buffer.data(), other.buffer.data() + other.buffer.size());
    update_string_views();
    return *this;
}